

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::CopyImage::FunctionalTest::compareImages
          (FunctionalTest *this,targetDesc *left_desc,GLubyte *left_data,GLuint left_x,GLuint left_y
          ,GLuint left_layer,GLuint left_level,targetDesc *right_desc,GLubyte *right_data,
          GLuint right_x,GLuint right_y,GLuint right_layer,GLuint right_level,GLuint region_width,
          GLuint region_height)

{
  ostringstream *this_00;
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  bool bVar5;
  GLuint left_pixel_size;
  GLuint right_pixel_size;
  long lVar6;
  GLubyte *pixel;
  GLubyte *left_pixel_data;
  uint uVar7;
  uint uVar8;
  GLubyte *right_pixel_data;
  bool bVar9;
  ulong local_2b0;
  string local_238;
  string local_218;
  GLuint right_widths [3];
  GLuint right_heights [3];
  GLuint left_widths [3];
  GLuint left_heights [3];
  GLuint right_depths [3];
  GLuint left_depths [3];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  calculateDimmensions
            ((FunctionalTest *)left_heights,left_desc->m_target,left_desc->m_level,
             left_desc->m_width,left_desc->m_height,left_widths,left_heights,left_depths);
  calculateDimmensions
            ((FunctionalTest *)right_heights,right_desc->m_target,right_desc->m_level,
             right_desc->m_width,right_desc->m_height,right_widths,right_heights,right_depths);
  GVar1 = left_widths[left_level];
  GVar2 = right_widths[right_level];
  GVar3 = left_heights[left_level];
  GVar4 = right_heights[right_level];
  left_pixel_size = Utils::getPixelSizeForFormat(left_desc->m_internal_format);
  right_pixel_size = Utils::getPixelSizeForFormat(right_desc->m_internal_format);
  bVar9 = region_height == 0;
  if (!bVar9) {
    local_2b0 = 0;
    do {
      if (region_width != 0) {
        lVar6 = 0;
        uVar8 = right_pixel_size * right_x;
        uVar7 = left_pixel_size * left_x;
        do {
          left_pixel_data =
               left_data +
               (ulong)uVar7 +
               (ulong)((left_y + (int)local_2b0) * GVar1 * left_pixel_size) +
               (ulong)(GVar3 * left_layer * GVar1 * left_pixel_size);
          right_pixel_data =
               right_data +
               (ulong)uVar8 +
               (ulong)((right_y + (int)local_2b0) * GVar2 * right_pixel_size) +
               (ulong)(GVar4 * right_layer * GVar2 * right_pixel_size);
          bVar5 = Utils::comparePixels
                            (left_pixel_size,left_pixel_data,right_pixel_size,right_pixel_data,
                             left_desc->m_internal_format);
          if ((!bVar5) &&
             (pixel = left_pixel_data,
             bVar5 = Utils::unpackAndComaprePixels
                               (left_desc->m_format,left_desc->m_type,left_desc->m_internal_format,
                                left_pixel_data,right_desc->m_format,right_desc->m_type,
                                right_desc->m_internal_format,right_pixel_data), !bVar5)) {
            local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Not matching pixels found. Left: [",0x22);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] lvl:",6);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", off: ",7);
            std::ostream::_M_insert<long>((long)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", data: ",8);
            Utils::getPixelString_abi_cxx11_
                      (&local_218,(Utils *)(ulong)left_desc->m_internal_format,
                       (GLenum)left_pixel_data,pixel);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,local_218._M_dataplus._M_p,local_218._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Right: [",10);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] lvl: ",7);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", off: ",7);
            std::ostream::_M_insert<long>((long)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", data: ",8);
            Utils::getPixelString_abi_cxx11_
                      (&local_238,(Utils *)(ulong)right_desc->m_internal_format,
                       (GLenum)right_pixel_data,pixel);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,local_238._M_dataplus._M_p,local_238._M_string_length);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            return bVar9;
          }
          lVar6 = lVar6 + -1;
          uVar7 = uVar7 + left_pixel_size;
          uVar8 = uVar8 + right_pixel_size;
        } while (-(ulong)region_width != lVar6);
      }
      local_2b0 = local_2b0 + 1;
      bVar9 = region_height <= local_2b0;
    } while (local_2b0 != region_height);
  }
  return bVar9;
}

Assistant:

bool FunctionalTest::compareImages(const targetDesc& left_desc, const GLubyte* left_data, GLuint left_x, GLuint left_y,
								   GLuint left_layer, GLuint left_level, const targetDesc& right_desc,
								   const glw::GLubyte* right_data, GLuint right_x, GLuint right_y, GLuint right_layer,
								   GLuint right_level, GLuint region_width, GLuint region_height) const
{
	/* Get level dimmensions */
	GLuint left_heights[FUNCTIONAL_TEST_N_LEVELS];
	GLuint left_widths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint left_depths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint right_heights[FUNCTIONAL_TEST_N_LEVELS];
	GLuint right_widths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint right_depths[FUNCTIONAL_TEST_N_LEVELS];

	calculateDimmensions(left_desc.m_target, left_desc.m_level, left_desc.m_width, left_desc.m_height, left_widths,
						 left_heights, left_depths);

	calculateDimmensions(right_desc.m_target, right_desc.m_level, right_desc.m_width, right_desc.m_height, right_widths,
						 right_heights, right_depths);

	/* Constants */
	/* Dimmensions */
	const GLuint left_height  = left_heights[left_level];
	const GLuint left_width   = left_widths[left_level];
	const GLuint right_height = right_heights[right_level];
	const GLuint right_width  = right_widths[right_level];
	/* Sizes */
	const GLuint left_pixel_size  = Utils::getPixelSizeForFormat(left_desc.m_internal_format);
	const GLuint left_line_size   = left_pixel_size * left_width;
	const GLuint left_layer_size  = left_line_size * left_height;
	const GLuint right_pixel_size = Utils::getPixelSizeForFormat(right_desc.m_internal_format);
	const GLuint right_line_size  = right_pixel_size * right_width;
	const GLuint right_layer_size = right_line_size * right_height;

	/* Offsets */
	const GLuint left_layer_offset	 = left_layer_size * left_layer;
	const GLuint left_reg_line_offset  = left_line_size * left_y;
	const GLuint left_reg_pix_offset   = left_pixel_size * left_x;
	const GLuint right_layer_offset	= right_layer_size * right_layer;
	const GLuint right_reg_line_offset = right_line_size * right_y;
	const GLuint right_reg_pix_offset  = right_pixel_size * right_x;

	/* Pointers */
	const GLubyte* left_layer_data  = left_data + left_layer_offset;
	const GLubyte* right_layer_data = right_data + right_layer_offset;

	/* For each line of region */
	for (GLuint y = 0; y < region_height; ++y)
	{
		/* Offsets */
		const GLuint left_line_offset  = left_reg_line_offset + y * left_line_size;
		const GLuint right_line_offset = right_reg_line_offset + y * right_line_size;

		/* Pointers */
		const GLubyte* left_line_data  = left_layer_data + left_line_offset;
		const GLubyte* right_line_data = right_layer_data + right_line_offset;

		/* For each pixel of region */
		for (GLuint x = 0; x < region_width; ++x)
		{
			/* Offsets */
			const GLuint left_pixel_offset  = left_reg_pix_offset + x * left_pixel_size;
			const GLuint right_pixel_offset = right_reg_pix_offset + x * right_pixel_size;

			/* Pointers */
			const GLubyte* left_pixel_data  = left_line_data + left_pixel_offset;
			const GLubyte* right_pixel_data = right_line_data + right_pixel_offset;

			/* Compare */
			if (false == Utils::comparePixels(left_pixel_size, left_pixel_data, right_pixel_size, right_pixel_data,
											  left_desc.m_internal_format))
			{
				if (false == Utils::unpackAndComaprePixels(left_desc.m_format, left_desc.m_type,
														   left_desc.m_internal_format, left_pixel_data,
														   right_desc.m_format, right_desc.m_type,
														   right_desc.m_internal_format, right_pixel_data))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Not matching pixels found. Left: [" << x + left_x << ", "
						<< y + left_y << ", " << left_layer << "] lvl:" << left_level
						<< ", off: " << left_pixel_data - left_data
						<< ", data: " << Utils::getPixelString(left_desc.m_internal_format, left_pixel_data)
						<< ". Right: [" << x + right_x << ", " << y + right_y << ", " << right_layer
						<< "] lvl: " << right_level << ", off: " << right_pixel_data - right_data
						<< ", data: " << Utils::getPixelString(right_desc.m_internal_format, right_pixel_data)
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}